

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLContextState.hpp
# Opt level: O2

bool __thiscall
Diligent::GLContextState::BoundImageInfo::operator!=(BoundImageInfo *this,BoundImageInfo *rhs)

{
  bool bVar1;
  
  bVar1 = true;
  if ((((this->InterfaceID == rhs->InterfaceID) && (this->GLHandle == rhs->GLHandle)) &&
      (this->MipLevel == rhs->MipLevel)) &&
     (((this->IsLayered == rhs->IsLayered && (this->Layer == rhs->Layer)) &&
      (this->Access == rhs->Access)))) {
    bVar1 = this->Format != rhs->Format;
  }
  return bVar1;
}

Assistant:

constexpr bool operator!=(const BoundImageInfo& rhs) const
        {
            // clang-format off
            return InterfaceID != rhs.InterfaceID ||
                   GLHandle    != rhs.GLHandle    ||
                   MipLevel    != rhs.MipLevel    ||
                   IsLayered   != rhs.IsLayered   ||
                   Layer       != rhs.Layer       ||
                   Access      != rhs.Access      ||
                   Format      != rhs.Format;
            // clang-format on
        }